

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

void __thiscall BtorSimVCDWriter::write_node_header(BtorSimVCDWriter *this,ModuleTreeNode *top)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  BtorSimVCDWriter *in_RSI;
  long in_RDI;
  ModuleTreeNode *s;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *__range1_1;
  string am_ident;
  string idx;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  j;
  iterator __end3;
  iterator __begin3;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  string type;
  uint32_t width;
  string symbol;
  int64_t id;
  pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  i;
  iterator __end1;
  iterator __begin1;
  map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *__range1;
  pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  *in_stack_fffffffffffffd98;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda0;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  ostream *in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
  local_188;
  undefined1 *local_180;
  string local_178 [32];
  string local_158 [32];
  long local_138;
  string local_130 [32];
  string local_110 [32];
  _Self local_f0;
  _Self local_e8;
  long local_e0;
  allocator local_d1;
  _Self local_d0;
  _Self local_c8;
  string local_c0 [32];
  _Self local_a0;
  _Self local_98;
  uint local_90;
  string local_80 [32];
  long local_60;
  long local_58;
  string local_50 [32];
  uint local_30;
  _Self local_28;
  _Self local_20;
  ModuleTreeNode *top_00;
  
  poVar3 = std::operator<<((ostream *)(in_RDI + 8),"$scope module ");
  poVar3 = std::operator<<(poVar3,(string *)in_RSI);
  std::operator<<(poVar3," $end\n");
  top_00 = (ModuleTreeNode *)&in_RSI->field_0x20;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
       ::begin((map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                *)in_stack_fffffffffffffd98);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
       ::end((map<long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              *)in_stack_fffffffffffffd98);
  while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)0x1251df);
    std::
    pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::pair((pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
            *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    local_60 = local_58;
    std::__cxx11::string::string(local_80,local_50);
    local_90 = local_30;
    local_98._M_node =
         (_Base_ptr)
         std::
         map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffd98,(key_type *)0x125240);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd98);
    bVar1 = std::operator!=(&local_98,&local_a0);
    if (bVar1) {
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
           ::find((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                   *)in_stack_fffffffffffffd98,(key_type *)0x1252b0);
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
           ::end((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                  *)in_stack_fffffffffffffd98);
      bVar2 = std::operator!=(&local_c8,&local_d0);
      bVar1 = false;
      if (bVar2) {
        pmVar4 = std::
                 map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                 ::operator[]((map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                               *)in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
        bVar1 = *pmVar4 == EVENT;
      }
      pcVar5 = "wire";
      if (bVar1) {
        pcVar5 = "event";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar5,&local_d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      poVar3 = std::operator<<((ostream *)(in_RDI + 8),"$var ");
      poVar3 = std::operator<<(poVar3,local_c0);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90);
      poVar3 = std::operator<<(poVar3," ");
      pmVar6 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
      poVar3 = std::operator<<(poVar3,(string *)pmVar6);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_80);
      std::operator<<(poVar3," $end\n");
      std::__cxx11::string::~string(local_c0);
    }
    else {
      local_e0 = in_RDI + 0x248;
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffd98);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd98);
      while (bVar1 = std::operator!=(&local_e8,&local_f0), bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1255b7);
        std::
        pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        if (local_138 == local_60) {
          std::__cxx11::string::string(local_158,local_130);
          std::__cxx11::string::string(local_178,local_110);
          in_stack_fffffffffffffde0 = std::operator<<((ostream *)(in_RDI + 8),"$var wire ");
          in_stack_fffffffffffffdd8 =
               (ostream *)std::ostream::operator<<(in_stack_fffffffffffffde0,local_90);
          poVar3 = std::operator<<(in_stack_fffffffffffffdd8," ");
          poVar3 = std::operator<<(poVar3,local_178);
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = std::operator<<(poVar3,local_80);
          in_stack_fffffffffffffdb0 =
               (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::operator<<(poVar3,"<");
          in_stack_fffffffffffffda8 =
               (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffdb0,std::hex);
          in_stack_fffffffffffffda0 =
               (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::operator<<((ostream *)in_stack_fffffffffffffda8,local_158);
          in_stack_fffffffffffffd98 =
               (pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffda0,std::dec);
          std::operator<<((ostream *)in_stack_fffffffffffffd98,"> $end\n");
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string(local_158);
        }
        std::
        pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffda0);
        std::
        _Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffda0);
      }
    }
    std::__cxx11::string::~string(local_80);
    std::
    pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::~pair((pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             *)0x1257da);
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)in_stack_fffffffffffffda0);
  }
  local_180 = &in_RSI->field_0x50;
  local_188._M_current =
       (ModuleTreeNode **)
       std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::begin
                 ((vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *)
                  in_stack_fffffffffffffd98);
  std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>::end
            ((vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_> *)
             in_stack_fffffffffffffd98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
                             *)in_stack_fffffffffffffda0,
                            (__normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
                             *)in_stack_fffffffffffffd98), bVar1) {
    __gnu_cxx::
    __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
    ::operator*(&local_188);
    write_node_header(in_RSI,top_00);
    __gnu_cxx::
    __normal_iterator<ModuleTreeNode_**,_std::vector<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>_>
    ::operator++(&local_188);
  }
  std::operator<<((ostream *)(in_RDI + 8),"$upscope $end\n");
  return;
}

Assistant:

void
BtorSimVCDWriter::write_node_header (ModuleTreeNode* top)
{
  vcd_file << "$scope module " << top->name << " $end\n";
  for (auto i : top->wire_names)
  {
    int64_t id         = i.first;
    std::string symbol = i.second.first;
    uint32_t width     = i.second.second;
    if (bv_identifiers.find (id) != bv_identifiers.end ())
    {
      std::string type =
          (clocks.find (id) != clocks.end () && clocks[id] == EVENT) ? "event"
                                                                     : "wire";
      vcd_file << "$var " << type << " " << width << " "
               << bv_identifiers[i.first] << " " << symbol << " $end\n";
    }
    else
      for (auto j : am_identifiers)
      {
        if (j.first.first == id)
        {
          std::string idx      = j.first.second;
          std::string am_ident = j.second;
          vcd_file << "$var wire " << width << " " << am_ident << " " << symbol
                   << "<" << std::hex << idx << std::dec << "> $end\n";
        }
      }
  }
  for (ModuleTreeNode* s : top->submodules)
  {
    write_node_header (s);
  }
  vcd_file << "$upscope $end\n";
}